

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O2

uint aom_sad128x64_avg_avx2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint8_t *second_pred
               )

{
  int in_EAX;
  uint uVar1;
  uint uVar2;
  
  uVar1 = sad_w64_avg_avx2(src_ptr,src_stride,ref_ptr,ref_stride,(int)second_pred,(uint8_t *)0x80,
                           in_EAX);
  uVar2 = sad_w64_avg_avx2(src_ptr + 0x40,src_stride,ref_ptr + 0x40,ref_stride,
                           (int)second_pred + 0x40,(uint8_t *)0x80,in_EAX);
  return uVar2 + uVar1;
}

Assistant:

unsigned int aom_sad128x64_avg_avx2(const uint8_t *src_ptr, int src_stride,
                                    const uint8_t *ref_ptr, int ref_stride,
                                    const uint8_t *second_pred) {
  unsigned int half_width = 64;
  uint32_t sum = sad_w64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride, 64,
                                  second_pred, 128);
  src_ptr += half_width;
  ref_ptr += half_width;
  second_pred += half_width;
  sum += sad_w64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride, 64,
                          second_pred, 128);
  return sum;
}